

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_evaluateASTWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t astNode,sysbvm_tuple_t environment)

{
  sysbvm_tuple_t sVar1;
  undefined1 local_48 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_8_1_3a3b9956 gcFrame;
  sysbvm_tuple_t environment_local;
  sysbvm_tuple_t astNode_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,8);
  memset(local_48,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_48);
  sVar1 = sysbvm_tuple_getType(context,astNode);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_type_getAstNodeEvaluationFunction(context,sVar1);
  if (gcFrameRecord.roots == (sysbvm_tuple_t *)0x0) {
    sysbvm_error("Cannot evaluate non AST node tuple.");
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_48);
  sVar1 = sysbvm_function_applyNoCheck2
                    (context,(sysbvm_tuple_t)gcFrameRecord.roots,astNode,environment);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_evaluateASTWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t astNode, sysbvm_tuple_t environment)
{
    struct {
        sysbvm_tuple_t function;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.function = sysbvm_type_getAstNodeEvaluationFunction(context, sysbvm_tuple_getType(context, astNode));
    if(!gcFrame.function)
        sysbvm_error("Cannot evaluate non AST node tuple.");

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_function_applyNoCheck2(context, gcFrame.function, astNode, environment);
}